

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int getnum_aux(lua_State *L,lua_State *L1,char **pc)

{
  byte bVar1;
  lua_Integer lVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  
  skip(pc);
  pbVar5 = (byte *)*pc;
  bVar1 = *pbVar5;
  if (bVar1 == 0x2a) {
    iVar7 = lua_gettop(L1);
    *pc = *pc + 1;
  }
  else {
    if (bVar1 == 0x2d) {
      pbVar4 = pbVar5 + 1;
      iVar6 = -1;
      *pc = (char *)pbVar4;
      bVar1 = pbVar5[1];
    }
    else {
      if (bVar1 == 0x2e) {
        lVar2 = lua_tointegerx(L1,-1,(int *)0x0);
        lua_settop(L1,-2);
        *pc = *pc + 1;
        return (int)lVar2;
      }
      iVar6 = 1;
      pbVar4 = pbVar5;
    }
    uVar3 = (ulong)bVar1;
    if ((""[uVar3 + 1] & 2) == 0) {
      luaL_error(L,"number expected (%s)");
      pbVar4 = (byte *)*pc;
      uVar3 = (ulong)*pbVar4;
    }
    iVar7 = 0;
    if ((""[uVar3 + 1] & 2) != 0) {
      iVar7 = 0;
      do {
        pbVar5 = pbVar4 + 1;
        *pc = (char *)pbVar5;
        iVar7 = (char)*pbVar4 + -0x30 + iVar7 * 10;
        pbVar4 = pbVar5;
      } while ((""[(ulong)*pbVar5 + 1] & 2) != 0);
    }
    iVar7 = iVar7 * iVar6;
  }
  return iVar7;
}

Assistant:

static int getnum_aux (lua_State *L, lua_State *L1, const char **pc) {
  int res = 0;
  int sig = 1;
  skip(pc);
  if (**pc == '.') {
    res = cast_int(lua_tointeger(L1, -1));
    lua_pop(L1, 1);
    (*pc)++;
    return res;
  }
  else if (**pc == '*') {
    res = lua_gettop(L1);
    (*pc)++;
    return res;
  }
  else if (**pc == '-') {
    sig = -1;
    (*pc)++;
  }
  if (!lisdigit(cast_uchar(**pc)))
    luaL_error(L, "number expected (%s)", *pc);
  while (lisdigit(cast_uchar(**pc))) res = res*10 + (*(*pc)++) - '0';
  return sig*res;
}